

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O1

bool ReadObject(HSQUIRRELVM v,SQUserPointer up,SQREADFUNC read,SQObjectPtr *o)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQSharedState *this;
  SQTable *pSVar3;
  long lVar4;
  SQObjectValue SVar5;
  SQObjectValue SVar6;
  SQInteger SVar7;
  SQChar *pSVar8;
  SQString *pSVar9;
  SQInteger len;
  SQUnsignedInteger32 _type;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 local_30;
  SQObjectType local_2c;
  
  SVar7 = (*read)(up,&local_2c,4);
  if (SVar7 == 4) {
    if ((int)local_2c < 0x5000002) {
      if (local_2c == OT_NULL) {
        SVar2 = (o->super_SQObject)._type;
        pSVar3 = (o->super_SQObject)._unVal.pTable;
        (o->super_SQObject)._type = OT_NULL;
        (o->super_SQObject)._unVal.pTable = (SQTable *)0x0;
        if ((SVar2 >> 0x1b & 1) == 0) {
          return true;
        }
        pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
          return true;
        }
        return true;
      }
      if (local_2c != OT_BOOL) {
LAB_00153cd0:
        pSVar8 = IdType2Name(local_2c);
        SQVM::Raise_Error(v,"cannot serialize a %s",pSVar8);
        return false;
      }
      SVar7 = (*read)(up,&local_38,8);
      if (SVar7 == 8) {
        (o->super_SQObject)._type = OT_BOOL;
        SVar5.nInteger._4_4_ = uStack_34;
        SVar5.nInteger._0_4_ = local_38;
        (o->super_SQObject)._unVal = SVar5;
        return true;
      }
    }
    else if (local_2c == OT_INTEGER) {
      SVar7 = (*read)(up,&local_38,8);
      if (SVar7 == 8) {
        SVar6.nInteger._4_4_ = uStack_34;
        SVar6.nInteger._0_4_ = local_38;
        if (((o->super_SQObject)._type & 0x8000000) != 0) {
          pSVar1 = &(((o->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                    super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(((o->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._vptr_SQRefCounted[2])();
          }
        }
        (o->super_SQObject)._type = OT_INTEGER;
        (o->super_SQObject)._unVal = SVar6;
        return true;
      }
    }
    else if (local_2c == OT_FLOAT) {
      SVar7 = (*read)(up,&local_38,4);
      if (SVar7 == 4) {
        if (((o->super_SQObject)._type & 0x8000000) != 0) {
          pSVar1 = &(((o->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                    super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            local_30 = local_38;
            (*(((o->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._vptr_SQRefCounted[2])();
            local_38 = local_30;
          }
        }
        (o->super_SQObject)._type = OT_FLOAT;
        (o->super_SQObject)._unVal.pTable = (SQTable *)0x0;
        *(undefined4 *)&(o->super_SQObject)._unVal = local_38;
        return true;
      }
    }
    else {
      if (local_2c != OT_STRING) goto LAB_00153cd0;
      SVar7 = (*read)(up,&local_38,8);
      if (SVar7 == 8) {
        pSVar8 = SQSharedState::GetScratchPad(v->_sharedstate,CONCAT44(uStack_34,local_38));
        lVar4 = CONCAT44(uStack_34,local_38);
        if ((lVar4 == 0) || (SVar7 = (*read)(up,pSVar8,lVar4), SVar7 == lVar4)) {
          this = v->_sharedstate;
          pSVar8 = SQSharedState::GetScratchPad(this,-1);
          pSVar9 = SQStringTable::Add(this->_stringtable,pSVar8,CONCAT44(uStack_34,local_38));
          pSVar3 = (o->super_SQObject)._unVal.pTable;
          SVar2 = (o->super_SQObject)._type;
          (o->super_SQObject)._type = OT_STRING;
          (o->super_SQObject)._unVal.pString = pSVar9;
          pSVar1 = &(pSVar9->super_SQRefCounted)._uiRef;
          *pSVar1 = *pSVar1 + 1;
          if ((SVar2 >> 0x1b & 1) == 0) {
            return true;
          }
          pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 != 0) {
            return true;
          }
          (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
          return true;
        }
      }
    }
  }
  SQVM::Raise_Error(v,
                    "io error, read function failure, the origin stream could be corrupted/trucated"
                   );
  return false;
}

Assistant:

bool ReadObject(HSQUIRRELVM v,SQUserPointer up,SQREADFUNC read,SQObjectPtr &o)
{
    SQUnsignedInteger32 _type;
    _CHECK_IO(SafeRead(v,read,up,&_type,sizeof(_type)));
    SQObjectType t = (SQObjectType)_type;
    switch(t){
    case OT_STRING:{
        SQInteger len;
        _CHECK_IO(SafeRead(v,read,up,&len,sizeof(SQInteger)));
        _CHECK_IO(SafeRead(v,read,up,_ss(v)->GetScratchPad(sq_rsl(len)),sq_rsl(len)));
        o=SQString::Create(_ss(v),_ss(v)->GetScratchPad(-1),len);
                   }
        break;
    case OT_INTEGER:{
        SQInteger i;
        _CHECK_IO(SafeRead(v,read,up,&i,sizeof(SQInteger))); o = i; break;
                    }
    case OT_BOOL:{
        SQInteger i;
        _CHECK_IO(SafeRead(v,read,up,&i,sizeof(SQInteger))); o._type = OT_BOOL; o._unVal.nInteger = i; break;
                    }
    case OT_FLOAT:{
        SQFloat f;
        _CHECK_IO(SafeRead(v,read,up,&f,sizeof(SQFloat))); o = f; break;
                  }
    case OT_NULL:
        o.Null();
        break;
    default:
        v->Raise_Error(_SC("cannot serialize a %s"),IdType2Name(t));
        return false;
    }
    return true;
}